

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# artest2.c
# Opt level: O0

double ar_mean(double *x,int N)

{
  int local_24;
  double dStack_20;
  int i;
  double mn;
  int N_local;
  double *x_local;
  
  dStack_20 = 0.0;
  for (local_24 = 0; local_24 < N; local_24 = local_24 + 1) {
    dStack_20 = x[local_24] + dStack_20;
  }
  return dStack_20 / (double)N;
}

Assistant:

double ar_mean(double *x, int N) {
	double mn;
	int i;

	mn = 0.0;

	for(i = 0; i < N;++i) {
		mn += x[i];
	}

	mn /= (double) N;

	return mn;
}